

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MainWindow.cpp
# Opt level: O1

void __thiscall MainWindow::updateFloatingDisplayVisibility(MainWindow *this)

{
  FloatingDisplay *pFVar1;
  FloatingDisplayVisibility FVar2;
  bool bVar3;
  
  FVar2 = getFloatingDisplayVisibility();
  if (FVar2 == FloatingDisplayVisibility_ALWAYS_HIDDEN) {
    bVar3 = false;
  }
  else {
    bVar3 = true;
    if (FVar2 != FloatingDisplayVisibility_ALWAYS_SHOWN) {
      bVar3 = (*(byte *)(*(long *)&this->field_0x20 + 9) & 0x80) == 0;
    }
  }
  pFVar1 = this->floatingDisplay;
  if (pFVar1 != (FloatingDisplay *)0x0) {
    (**(code **)(*(long *)pFVar1 + 0x68))(pFVar1,bVar3);
    return;
  }
  if (bVar3 != false) {
    showFloatingDisplay(this);
    return;
  }
  return;
}

Assistant:

void MainWindow::updateFloatingDisplayVisibility() {
	FloatingDisplayVisibility visibility = getFloatingDisplayVisibility();
	bool visible = visibility == FloatingDisplayVisibility_ALWAYS_SHOWN
		|| !(visibility == FloatingDisplayVisibility_ALWAYS_HIDDEN || isVisible());
	if (floatingDisplay == NULL) {
		if (visible) showFloatingDisplay();
	} else {
		floatingDisplay->setVisible(visible);
	}
}